

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_encode_ciphertext(uint16_t *ciphertext,uint p,uint q,BinarySink *bs)

{
  uint16_t scale;
  uint16_t *out;
  NTRUEncodeSchedule *sched;
  uint uVar1;
  
  out = (uint16_t *)safemalloc((ulong)p,2,0);
  uVar1 = (q >> 1) + 1;
  ntru_bias(out,ciphertext,uVar1 - uVar1 % 3,p,q);
  scale = invert(3,(uint16_t)q,
                 SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x1000000000000)) / ZEXT416(q & 0xffff),0));
  ntru_scale(out,out,scale,p,q);
  sched = ntru_encode_ciphertext_schedule(p,q);
  ntru_encode(sched,out,bs);
  ntru_encode_schedule_free(sched);
  ring_free(out,p);
  return;
}

Assistant:

void ntru_encode_ciphertext(const uint16_t *ciphertext, unsigned p, unsigned q,
                            BinarySink *bs)
{
    SETUP;

    /*
     * Bias the ciphertext, and scale down by 1/3, which we do by
     * modular multiplication by the inverse of 3 mod q. (That only
     * works if we know the inputs are all _exact_ multiples of 3
     * - but we do!)
     */
    uint16_t *biased_ciphertext = snewn(p, uint16_t);
    ntru_bias(biased_ciphertext, ciphertext, 3 * ciphertext_bias(q), p, q);
    ntru_scale(biased_ciphertext, biased_ciphertext, INVERT(3), p, q);

    /* Encode. */
    NTRUEncodeSchedule *sched = ntru_encode_ciphertext_schedule(p, q);
    ntru_encode(sched, biased_ciphertext, bs);
    ntru_encode_schedule_free(sched);

    ring_free(biased_ciphertext, p);
}